

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_options(archive_read *a,char *key,char *val)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  iso9660 *iso9660;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  iVar2 = strcmp(in_RSI,"joliet");
  if (iVar2 == 0) {
    if ((((in_RDX == (char *)0x0) || (iVar2 = strcmp(in_RDX,"off"), iVar2 == 0)) ||
        (iVar2 = strcmp(in_RDX,"ignore"), iVar2 == 0)) ||
       ((iVar2 = strcmp(in_RDX,"disable"), iVar2 == 0 || (iVar2 = strcmp(in_RDX,"0"), iVar2 == 0))))
    {
      *(undefined4 *)(lVar1 + 4) = 0;
    }
    else {
      *(undefined4 *)(lVar1 + 4) = 1;
    }
    return 0;
  }
  iVar2 = strcmp(in_RSI,"rockridge");
  if ((iVar2 != 0) && (iVar2 = strcmp(in_RSI,"Rockridge"), iVar2 != 0)) {
    return -0x14;
  }
  *(uint *)(lVar1 + 8) = (uint)(in_RDX != (char *)0x0);
  return 0;
}

Assistant:

static int
archive_read_format_iso9660_options(struct archive_read *a,
		const char *key, const char *val)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (strcmp(key, "joliet") == 0) {
		if (val == NULL || strcmp(val, "off") == 0 ||
				strcmp(val, "ignore") == 0 ||
				strcmp(val, "disable") == 0 ||
				strcmp(val, "0") == 0)
			iso9660->opt_support_joliet = 0;
		else
			iso9660->opt_support_joliet = 1;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "rockridge") == 0 ||
	    strcmp(key, "Rockridge") == 0) {
		iso9660->opt_support_rockridge = val != NULL;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}